

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileReturn(jx9_gen_state *pGen)

{
  sxi32 sVar1;
  uint local_1c;
  sxi32 rc;
  sxi32 nRet;
  jx9_gen_state *pGen_local;
  
  local_1c = 0;
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x40000) == 0)) {
    sVar1 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar1 == -10) {
      return -10;
    }
    local_1c = (uint)(sVar1 != -3);
  }
  jx9VmEmitInstr(pGen->pVm,1,local_1c,0,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

static sxi32 jx9CompileReturn(jx9_gen_state *pGen)
{
	sxi32 nRet = 0; /* TRUE if there is a return value */
	sxi32 rc;
	/* Jump the 'return' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Compile the expression */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}else if(rc != SXERR_EMPTY ){
			nRet = 1;
		}
	}
	/* Emit the done instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, nRet, 0, 0, 0);
	return SXRET_OK;
}